

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsf_Emu.cpp
# Opt level: O3

void __thiscall Nsf_Emu::unload(Nsf_Emu *this)

{
  uchar *__ptr;
  
  free(this->vrc6);
  this->vrc6 = (Nes_Vrc6_Apu *)0x0;
  free(this->namco);
  this->namco = (Nes_Namco_Apu *)0x0;
  free(this->fme7);
  this->fme7 = (Nes_Fme7_Apu *)0x0;
  __ptr = (this->rom).super_Rom_Data_.rom.begin_;
  (this->rom).super_Rom_Data_.rom.begin_ = (uchar *)0x0;
  (this->rom).super_Rom_Data_.rom.size_ = 0;
  free(__ptr);
  Music_Emu::unload((Music_Emu *)this);
  return;
}

Assistant:

void Nsf_Emu::unload()
{
	#if !NSF_EMU_APU_ONLY
	{
		delete vrc6;
		vrc6  = 0;
		
		delete namco;
		namco = 0;
		
		delete fme7;
		fme7  = 0;
	}
	#endif
	
	rom.clear();
	Music_Emu::unload();
}